

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void SetMouseCursor(int cursor)

{
  GLFWwindow *windowHandle;
  GLFWcursor *cursorHandle;
  
  windowHandle = CORE.Window.handle;
  CORE.Input.Mouse.cursor = cursor;
  if (cursor == 0) {
    cursorHandle = (GLFWcursor *)0x0;
  }
  else {
    cursorHandle = glfwCreateStandardCursor(cursor + 0x36000);
  }
  glfwSetCursor(windowHandle,cursorHandle);
  return;
}

Assistant:

void SetMouseCursor(int cursor)
{
#if defined(PLATFORM_DESKTOP)
    CORE.Input.Mouse.cursor = cursor;
    if (cursor == MOUSE_CURSOR_DEFAULT) glfwSetCursor(CORE.Window.handle, NULL);
    else
    {
        // NOTE: We are relating internal GLFW enum values to our MouseCursor enum values
        glfwSetCursor(CORE.Window.handle, glfwCreateStandardCursor(0x00036000 + cursor));
    }
#endif
}